

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QUnicodeTables::detachAndConvertCase<QString_const>
          (QString *__return_storage_ptr__,QUnicodeTables *this,QString *str,QStringIterator it,
          Case which)

{
  char32_t uc;
  iterator pQVar1;
  byte bVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  R_conflict14 RVar5;
  QChar local_48 [4];
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)this);
  pQVar1 = QString::begin(__return_storage_ptr__);
  pcVar3 = (char16_t *)((long)pQVar1 + ((long)it.pos - (long)it.i));
  do {
    local_48 = (QChar  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    uc = QStringIterator::next(&it,L'�');
    RVar5 = fullConvertCase(uc,(Case)str);
    local_48 = (QChar  [4])RVar5.chars;
    bVar2 = RVar5.sz;
    local_40 = CONCAT11(local_40._1_1_,bVar2);
    if ((char)bVar2 < '\x02') {
      *pcVar3 = RVar5.chars[0];
      pcVar3 = pcVar3 + 1;
    }
    else if ((bVar2 == 2) && (*pcVar3 == RVar5.chars[0])) {
      pcVar3[1] = RVar5.chars[1];
      pcVar3 = pcVar3 + 2;
    }
    else {
      lVar4 = (long)pcVar3 - (long)(__return_storage_ptr__->d).ptr;
      QString::replace(__return_storage_ptr__,lVar4 >> 1,1,local_48,(ulong)bVar2);
      pcVar3 = (char16_t *)
               ((long)(__return_storage_ptr__->d).ptr + (long)(char)local_40 * 2 + lVar4);
    }
  } while (it.pos < it.e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}